

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O3

Entity * __thiscall Entity::getPlayerCollision(Entity *this)

{
  ResourceManager *this_00;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  Entity *pEVar3;
  _List_node_base local_30;
  long local_20;
  
  local_30._M_next = &local_30;
  local_20 = 0;
  local_30._M_prev = local_30._M_next;
  this_00 = ResourceManager::getInstance();
  p_Var1 = (_List_node_base *)ResourceManager::getData(this_00,1);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = p_Var1;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  local_20 = local_20 + 1;
  pEVar3 = checkCollisions(this,(list<Entity_*,_std::allocator<Entity_*>_> *)&local_30);
  p_Var1 = local_30._M_next;
  while (p_Var1 != &local_30) {
    p_Var2 = (((_List_base<Entity_*,_std::allocator<Entity_*>_> *)&p_Var1->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var1,0x18);
    p_Var1 = p_Var2;
  }
  return pEVar3;
}

Assistant:

Entity *Entity::getPlayerCollision(void)
{
   std::list<Entity *> e;

   ResourceManager& rm = ResourceManager::getInstance();
   Player *player = (Player *)rm.getData(RES_PLAYER);

   e.push_back(player);

   Entity *ret = checkCollisions(e);
   e.clear();
   return ret;
}